

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeMemStringify(Mem *pMem,u8 enc,u8 bForce)

{
  undefined2 uVar1;
  ulong uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ushort uVar6;
  int iVar7;
  u32 uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  char *__dest;
  double dVar12;
  undefined8 uStack_50;
  StrAccum local_48;
  
  if (pMem->szMalloc < 0x20) {
    uStack_50 = 0x139f9c;
    iVar7 = sqlite3VdbeMemGrow(pMem,0x20,0);
    if (iVar7 != 0) {
      pMem->enc = '\0';
      return 7;
    }
    __dest = pMem->z;
    uVar6 = pMem->flags;
  }
  else {
    __dest = pMem->zMalloc;
    pMem->z = __dest;
    uVar6 = pMem->flags & 0x2d;
    pMem->flags = uVar6;
  }
  if ((uVar6 & 4) == 0) {
    local_48.db = (sqlite3 *)0x0;
    local_48.nAlloc = 0x20;
    local_48.mxAlloc = 0;
    local_48.nChar = 0;
    local_48.accError = '\0';
    local_48.printfFlags = '\0';
    if ((uVar6 & 0x20) == 0) {
      dVar12 = (pMem->u).r;
    }
    else {
      dVar12 = (double)(pMem->u).i;
    }
    uStack_50 = 0x13a0a7;
    local_48.zText = __dest;
    sqlite3_str_appendf(&local_48,"%!.15g",dVar12);
    __dest[local_48.nChar] = '\0';
    uVar8 = local_48.nChar;
  }
  else {
    uVar2 = (pMem->u).i;
    uVar9 = -uVar2;
    if (0 < (long)uVar2) {
      uVar9 = uVar2;
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar9;
    local_48._20_8_ =
         CONCAT71(local_48._21_7_,
                  (char)uVar9 +
                  ((byte)(SUB164(auVar4 * ZEXT816(0xcccccccccccccccd),8) >> 2) & 0xfe) * -5) &
         0xffffffffffff00ff | 0x30;
    iVar7 = 0x14;
    if (9 < uVar9) {
      lVar11 = 0x13;
      do {
        uVar10 = uVar9 / 10;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar10;
        *(byte *)((long)&local_48.db + lVar11) =
             (char)uVar10 + SUB161(auVar5 * ZEXT816(0x199999999999999a),8) * -10 | 0x30;
        lVar11 = lVar11 + -1;
        bVar3 = 99 < uVar9;
        uVar9 = uVar10;
      } while (bVar3);
      iVar7 = (int)lVar11 + 1;
    }
    if ((long)uVar2 < 0) {
      *(undefined1 *)((long)&uStack_50 + (long)iVar7 + 7) = 0x2d;
      lVar11 = (long)iVar7 + -1;
      iVar7 = (int)lVar11;
    }
    else {
      lVar11 = (long)iVar7;
    }
    uStack_50 = 0x13a0d5;
    memcpy(__dest,(void *)((long)&local_48.db + lVar11),0x16 - lVar11);
    uVar8 = 0x15 - iVar7;
  }
  pMem->n = uVar8;
  pMem->enc = '\x01';
  uVar1 = pMem->flags;
  uVar6 = uVar1 & 0xffd3;
  if (bForce == '\0') {
    uVar6 = uVar1;
  }
  pMem->flags = uVar6 | 0x202;
  if (enc != '\x01') {
    uStack_50 = 0x13a110;
    sqlite3VdbeMemTranslate(pMem,enc);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemStringify(Mem *pMem, u8 enc, u8 bForce){
  const int nByte = 32;

  assert( pMem!=0 );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( !(pMem->flags&MEM_Zero) );
  assert( !(pMem->flags&(MEM_Str|MEM_Blob)) );
  assert( pMem->flags&(MEM_Int|MEM_Real|MEM_IntReal) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );


  if( sqlite3VdbeMemClearAndResize(pMem, nByte) ){
    pMem->enc = 0;
    return SQLITE_NOMEM_BKPT;
  }

  vdbeMemRenderNum(nByte, pMem->z, pMem);
  assert( pMem->z!=0 );
  assert( pMem->n==(int)sqlite3Strlen30NN(pMem->z) );
  pMem->enc = SQLITE_UTF8;
  pMem->flags |= MEM_Str|MEM_Term;
  if( bForce ) pMem->flags &= ~(MEM_Int|MEM_Real|MEM_IntReal);
  sqlite3VdbeChangeEncoding(pMem, enc);
  return SQLITE_OK;
}